

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O0

void h2v1_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                    JSAMPARRAY output_data)

{
  uint uVar1;
  long in_RCX;
  JSAMPARRAY in_RDX;
  long in_RSI;
  long in_RDI;
  int bias;
  JSAMPROW outptr;
  JSAMPROW inptr;
  JDIMENSION output_cols;
  JDIMENSION outcol;
  int inrow;
  uint local_44;
  undefined1 *local_40;
  byte *local_38;
  uint local_28;
  int local_24;
  
  uVar1 = *(int *)(in_RSI + 0x1c) * *(int *)(in_RSI + 0x24);
  expand_right_edge(in_RDX,*(int *)(in_RDI + 0x160),*(JDIMENSION *)(in_RDI + 0x30),uVar1 * 2);
  for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x160); local_24 = local_24 + 1) {
    local_38 = in_RDX[local_24];
    local_44 = 0;
    local_40 = *(undefined1 **)(in_RCX + (long)local_24 * 8);
    for (local_28 = 0; local_28 < uVar1; local_28 = local_28 + 1) {
      *local_40 = (char)((int)((uint)*local_38 + (uint)local_38[1] + local_44) >> 1);
      local_44 = local_44 ^ 1;
      local_38 = local_38 + 2;
      local_40 = local_40 + 1;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_downsample (j_compress_ptr cinfo, jpeg_component_info * compptr,
		 JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int inrow;
  JDIMENSION outcol;
  JDIMENSION output_cols = compptr->width_in_blocks * compptr->DCT_h_scaled_size;
  register JSAMPROW inptr, outptr;
  register int bias;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data, cinfo->max_v_samp_factor,
		    cinfo->image_width, output_cols * 2);

  for (inrow = 0; inrow < cinfo->max_v_samp_factor; inrow++) {
    outptr = output_data[inrow];
    inptr = input_data[inrow];
    bias = 0;			/* bias = 0,1,0,1,... for successive samples */
    for (outcol = 0; outcol < output_cols; outcol++) {
      *outptr++ = (JSAMPLE) ((GETJSAMPLE(*inptr) + GETJSAMPLE(inptr[1])
			      + bias) >> 1);
      bias ^= 1;		/* 0=>1, 1=>0 */
      inptr += 2;
    }
  }
}